

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::IssueMessage(cmLocalGenerator *this,MessageType t,string *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *source;
  size_type sVar2;
  bool bVar3;
  char *__s;
  cmListFileContext lfc;
  cmOutputConverter converter;
  cmListFileContext local_c0;
  string local_78;
  Directory local_58;
  
  local_c0.Name._M_dataplus._M_p = (pointer)&local_c0.Name.field_2;
  local_c0.Name._M_string_length = 0;
  local_c0.Name.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_c0.FilePath.field_2;
  local_c0.FilePath._M_string_length = 0;
  local_c0.FilePath.field_2._M_local_buf[0] = '\0';
  local_c0.Line = 0;
  local_c0.FilePath._M_dataplus._M_p = (pointer)paVar1;
  cmState::Snapshot::GetDirectory(&local_58,&this->StateSnapshot);
  __s = cmState::Directory::GetCurrentSource(&local_58);
  sVar2 = local_c0.FilePath._M_string_length;
  source = &local_c0.FilePath;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)source,0,(char *)sVar2,(ulong)__s);
  std::__cxx11::string::append((char *)source);
  bVar3 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance);
  if (!bVar3) {
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_58,this->StateSnapshot);
    cmOutputConverter::Convert(&local_78,(cmOutputConverter *)&local_58,source,HOME,UNCHANGED);
    std::__cxx11::string::operator=((string *)source,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  local_c0.Line = 0;
  cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,t,text,&local_c0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.FilePath._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.FilePath._M_dataplus._M_p,
                    CONCAT71(local_c0.FilePath.field_2._M_allocated_capacity._1_7_,
                             local_c0.FilePath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.Name._M_dataplus._M_p != &local_c0.Name.field_2) {
    operator_delete(local_c0.Name._M_dataplus._M_p,
                    CONCAT71(local_c0.Name.field_2._M_allocated_capacity._1_7_,
                             local_c0.Name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::IssueMessage(cmake::MessageType t,
                                    std::string const& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->StateSnapshot.GetDirectory().GetCurrentSource();
  lfc.FilePath += "/CMakeLists.txt";

  if(!this->GlobalGenerator->GetCMakeInstance()->GetIsInTryCompile())
    {
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmLocalGenerator::HOME);
    }
  lfc.Line = 0;
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(t, text, lfc);
}